

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.c
# Opt level: O1

void render_line_mode4(gba_ppu_t *ppu)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  int x;
  long lVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ushort uVar9;
  uint8_t *puVar10;
  ushort uVar11;
  ulong uVar12;
  byte bVar13;
  uint uVar14;
  uint uVar15;
  byte bVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  bool bVar21;
  _Bool bg_enabled [4];
  _Bool bg_top [6];
  byte local_86 [4];
  byte local_82 [4];
  byte local_7e;
  byte local_7d;
  byte local_7c [4];
  byte local_78;
  byte local_77;
  ushort local_76;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  color_t (*local_50) [240];
  ulong local_48;
  ulong local_40;
  gba_color_t (*local_38) [240];
  
  if (((uint)ppu->DISPCNT & 0x1000) != 0) {
    render_obj(ppu);
  }
  if (((uint)ppu->DISPCNT & 0x400) == 0) {
    lVar4 = 0;
    do {
      ppu->bgbuf[2][lVar4].raw = *(ushort *)ppu->pram | 0x8000;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0xf0);
  }
  else {
    uVar11 = ppu->y;
    lVar4 = 0;
    do {
      puVar10 = ppu->vram + (ulong)uVar11 * 0xf0;
      if (((uint)ppu->DISPCNT & 0x10) != 0) {
        puVar10 = ppu->vram + (ulong)uVar11 * 0xf0 + 0xa000;
      }
      if ((ulong)puVar10[lVar4] == 0) {
        uVar9 = *(ushort *)ppu->pram | 0x8000;
      }
      else {
        uVar9 = *(ushort *)(ppu->pram + (ulong)puVar10[lVar4] * 2) & 0x7fff;
      }
      ppu->bgbuf[2][lVar4].raw = uVar9;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0xf0);
  }
  uVar20 = 0;
  dbg_line_drawn();
  refresh_background_priorities(ppu);
  uVar8 = (ppu->BLDALPHA).raw & 0x1f;
  if (0xf < (ushort)uVar8) {
    uVar8 = 0x10;
  }
  uVar6 = (ppu->BLDALPHA).raw >> 8 & 0x1f;
  if (0xf < (ushort)uVar6) {
    uVar6 = 0x10;
  }
  local_5c = (ppu->BLDY).raw & 0x1f;
  if (0xf < (ushort)local_5c) {
    local_5c = 0x10;
  }
  bVar13 = (byte)((ppu->DISPCNT).raw >> 8);
  local_86[0] = bVar13 & 1;
  local_86[1] = bVar13 >> 1 & 1;
  local_86[2] = bVar13 >> 2 & 1;
  local_86[3] = bVar13 >> 3 & 1;
  bVar13 = (byte)(ppu->BLDCNT).raw;
  local_7c[0] = bVar13 & 1;
  local_7c[1] = bVar13 >> 1 & 1;
  local_7c[2] = bVar13 >> 2 & 1;
  local_7c[3] = bVar13 >> 3 & 1;
  local_78 = bVar13 >> 4 & 1;
  local_77 = bVar13 >> 5 & 1;
  bVar13 = (byte)((ppu->BLDCNT).raw >> 8);
  local_82[0] = bVar13 & 1;
  local_82[1] = bVar13 >> 1 & 1;
  local_82[2] = bVar13 >> 2 & 1;
  local_82[3] = bVar13 >> 3 & 1;
  local_7e = bVar13 >> 4 & 1;
  local_7d = bVar13 >> 5 & 1;
  local_76 = *(ushort *)ppu->pram;
  local_48 = (ulong)ppu->y;
  local_38 = ppu->bgbuf;
  local_50 = ppu->screen;
  uVar12 = local_48;
  do {
    uVar11 = (ushort)uVar12;
    if ((byte)(ppu->WIN0H).raw < uVar20 || uVar20 < (ppu->WIN0H).raw >> 8) {
      bVar21 = false;
    }
    else {
      bVar21 = uVar11 <= ((ppu->WIN0V).raw & 0xff) && (ppu->WIN0V).raw >> 8 <= uVar11;
    }
    if ((byte)(ppu->WIN1H).raw < uVar20 || uVar20 < (ppu->WIN1H).raw >> 8) {
      bVar5 = false;
    }
    else {
      bVar5 = uVar11 <= ((ppu->WIN1V).raw & 0xff) && (ppu->WIN1V).raw >> 8 <= uVar11;
    }
    uVar11 = (ppu->DISPCNT).raw;
    bVar13 = (byte)(uVar11 >> 8);
    if ((bVar13 >> 5 & 1 & bVar21) == 1) {
      bVar13 = *(byte *)&ppu->WININ;
LAB_00119086:
      uVar9 = (ushort)(bVar13 >> 5);
    }
    else {
      if ((bVar13 >> 6 & 1 & bVar5) == 1) {
        uVar9 = (ppu->WININ).raw;
      }
      else {
        if (((short)uVar11 < 0 & ppu->obj_window[uVar20]) != 1) {
          uVar9 = 1;
          if ((uVar11 & 0x6000) != 0 && (bVar21 == false && bVar5 == false)) {
            bVar13 = *(byte *)&ppu->WINOUT;
            goto LAB_00119086;
          }
          goto LAB_001190cc;
        }
        uVar9 = (ppu->WINOUT).raw;
      }
      uVar9 = uVar9 >> 0xd;
    }
LAB_001190cc:
    uVar11 = (ppu->BLDCNT).raw;
    local_58 = uVar11 >> 6 & 3;
    local_54 = uVar11 & 0xc0;
    uVar3 = local_54;
    local_64 = (black.raw & 0x1f) * local_5c;
    local_68 = (black.raw >> 5 & 0x1f) * local_5c;
    local_60 = (black.raw >> 10 & 0x1f) * local_5c;
    local_70 = (white.raw & 0x1f) * local_5c;
    local_74 = (white.raw >> 5 & 0x1f) * local_5c;
    local_6c = (white.raw >> 10 & 0x1f) * local_5c;
    iVar17 = 5;
    uVar12 = 3;
    local_40 = (ulong)local_58;
    uVar18 = (uint)local_76;
    uVar7 = uVar18;
    do {
      iVar2 = background_priorities[uVar12];
      lVar4 = (long)iVar17;
      if ((uVar9 & 1) == 0) {
        bVar13 = 0;
      }
      else {
        local_54._0_2_ = (short)(uVar11 & 0xc0);
        bVar13 = ((short)local_54 == 0x40 & local_82[lVar4] | (char)uVar11 < '\0') & local_7c[iVar2]
        ;
      }
      uVar1 = ppu->bgbuf[iVar2][uVar20].raw;
      uVar14 = (uint)uVar1;
      bVar16 = -1 < (short)uVar1 & local_86[iVar2];
      uVar15 = (uint)(byte)(0x10 - (char)local_5c);
      local_54 = uVar3;
      if ((bVar16 == 1) && (bVar13 != 0)) {
        switch(local_58) {
        case 0:
          render_line_mode4_cold_2();
          goto switchD_001193b1_caseD_119593;
        case 1:
          uVar7 = (uVar14 & 0x1f) * uVar8 + (uVar18 & 0x1f) * uVar6 >> 4;
          if (0x1e < uVar7) {
            uVar7 = 0x1f;
          }
          uVar14 = (uVar1 >> 5 & 0x1f) * uVar8 + (uVar18 >> 5 & 0x1f) * uVar6 >> 4;
          if (0x1e < uVar14) {
            uVar14 = 0x1f;
          }
          uVar18 = (uVar1 >> 10) * uVar8 + (uVar18 >> 10 & 0x1f) * uVar6;
          break;
        case 2:
          uVar7 = (uVar14 & 0x1f) * uVar15 + local_70 >> 4;
          if (0x1e < uVar7) {
            uVar7 = 0x1f;
          }
          uVar14 = (uVar1 >> 5 & 0x1f) * uVar15 + local_74 >> 4;
          if (0x1e < uVar14) {
            uVar14 = 0x1f;
          }
          uVar18 = (uVar1 >> 10) * uVar15 + local_6c;
          break;
        case 3:
          uVar7 = (uVar14 & 0x1f) * uVar15 + local_64 >> 4;
          if (0x1e < uVar7) {
            uVar7 = 0x1f;
          }
          uVar14 = (uVar1 >> 5 & 0x1f) * uVar15 + local_68 >> 4;
          if (0x1e < uVar14) {
            uVar14 = 0x1f;
          }
          uVar18 = (uVar1 >> 10) * uVar15 + local_60;
        }
        uVar18 = uVar18 >> 4;
        if (0x1e < uVar18) {
          uVar18 = 0x1f;
        }
        uVar18 = uVar7 | uVar18 << 10 | uVar14 << 5;
LAB_00119344:
        uVar7 = uVar18;
        uVar14 = (uint)uVar1;
        iVar17 = iVar2;
      }
      else {
        uVar14 = uVar18;
        uVar18 = (uint)uVar1;
        if (bVar16 != 0) goto LAB_00119344;
      }
      uVar18 = uVar14;
      if (uVar12 == ppu->obj_priorities[uVar20]) {
        uVar1 = ppu->objbuf[uVar20].raw;
        bVar21 = -1 < (short)uVar1;
        uVar19 = (uint)uVar1;
        if (bVar21) {
          uVar7 = uVar19;
        }
        if (bVar21) {
          uVar18 = uVar19;
          iVar17 = 4;
        }
        if ((byte)(bVar21 & ppu->obj_alpha[uVar20] & ((char)uVar11 < '\0' | local_82[lVar4])) != 1)
        goto LAB_001194f1;
        switch(local_58) {
        case 0:
switchD_001193b1_caseD_119593:
          render_line_mode4_cold_1();
        default:
          uVar18 = (uVar1 & 0x1f) * uVar8 + (uVar14 & 0x1f) * uVar6 >> 4;
          if (0x1e < uVar18) {
            uVar18 = 0x1f;
          }
          uVar7 = (uVar1 >> 5 & 0x1f) * uVar8 + (uVar14 >> 5 & 0x1f) * uVar6 >> 4;
          if (0x1e < uVar7) {
            uVar7 = 0x1f;
          }
          uVar15 = (uVar1 >> 10) * uVar8 + (uVar14 >> 10 & 0x1f) * uVar6 >> 4;
          if (0x1e < uVar15) {
            uVar15 = 0x1f;
          }
          uVar7 = uVar7 << 5;
          goto LAB_001194e2;
        case 2:
          uVar18 = (uVar1 & 0x1f) * uVar15 + local_70 >> 4;
          if (0x1e < uVar18) {
            uVar18 = 0x1f;
          }
          uVar7 = (uVar1 >> 5 & 0x1f) * uVar15 + local_74 >> 4;
          if (0x1e < uVar7) {
            uVar7 = 0x1f;
          }
          uVar15 = (uVar1 >> 10) * uVar15 + local_6c;
          break;
        case 3:
          uVar18 = (uVar19 & 0x1f) * uVar15 + local_64 >> 4;
          if (0x1e < uVar18) {
            uVar18 = 0x1f;
          }
          uVar7 = (uVar1 >> 5 & 0x1f) * uVar15 + local_68 >> 4;
          if (0x1e < uVar7) {
            uVar7 = 0x1f;
          }
          uVar15 = (uVar1 >> 10) * uVar15 + local_60;
        }
        uVar7 = uVar7 << 5;
        uVar15 = uVar15 >> 4;
        if (0x1e < uVar15) {
          uVar15 = 0x1f;
        }
LAB_001194e2:
        uVar7 = uVar18 | uVar15 << 10 | uVar7;
        iVar17 = 4;
        uVar18 = (uint)uVar1;
      }
LAB_001194f1:
      bVar21 = uVar12 != 0;
      uVar12 = uVar12 - 1;
    } while (bVar21);
    local_50[local_48][uVar20].a = 0xff;
    local_50[local_48][uVar20].r = ((byte)uVar7 & 7) + (byte)uVar7 * '\b';
    bVar13 = (byte)((uVar7 & 0xffff) >> 5);
    local_50[local_48][uVar20].g = (bVar13 & 7) + bVar13 * '\b';
    bVar13 = (byte)((uVar7 & 0xffff) >> 10);
    local_50[local_48][uVar20].b = (bVar13 & 7) + bVar13 * '\b';
    uVar20 = uVar20 + 1;
    uVar12 = local_48;
    if (uVar20 == 0xf0) {
      return;
    }
  } while( true );
}

Assistant:

void render_line_mode4(gba_ppu_t* ppu) {
    if (ppu->DISPCNT.screen_display_obj) {
        render_obj(ppu);
    }
    if (ppu->DISPCNT.screen_display_bg2) {
        for (int x = 0; x < GBA_SCREEN_X; x++) {
            int offset = x + (ppu->y * GBA_SCREEN_X);
            int index = ppu->DISPCNT.display_frame_select * 0xA000 + offset;
            int tile = ppu->vram[index];
            if (tile == 0) {
                ppu->bgbuf[2][x].raw = half_from_byte_array(ppu->pram, 0);
                ppu->bgbuf[2][x].transparent = true;
            } else {
                ppu->bgbuf[2][x].raw = half_from_byte_array(ppu->pram, (0x20 * PALETTE_BANK_BACKGROUND + 2 * tile)) & 0x7FFF;
                ppu->bgbuf[2][x].transparent = false;
            }
        }
    } else {
        for (int x = 0; x < GBA_SCREEN_X; x++) {
            ppu->bgbuf[2][x].raw = half_from_byte_array(ppu->pram, 0);
            ppu->bgbuf[2][x].transparent = true;
        }
    }

    dbg_line_drawn();
    refresh_background_priorities(ppu);
    merge_bgs(ppu);
}